

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txt.cpp
# Opt level: O3

void __thiscall grib2dec_demo::Txt::setComponent(Txt *this,G2DEC_Message *message)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  ostream *poVar4;
  long lVar5;
  int iVar6;
  
  poVar4 = (this->super_Output).out;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Parameter id: ",0xe);
  plVar3 = (long *)std::ostream::operator<<((ostream *)poVar4,message->parameter);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((this->super_Output).out,"Latitude: [",0xb);
  poVar4 = std::ostream::_M_insert<double>((message->grid).lat1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  poVar4 = std::ostream::_M_insert<double>((message->grid).lat2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  poVar4 = std::ostream::_M_insert<double>((message->grid).latInc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Longitude: [",0xe);
  poVar4 = std::ostream::_M_insert<double>((message->grid).lon1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  poVar4 = std::ostream::_M_insert<double>((message->grid).lon2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  poVar4 = std::ostream::_M_insert<double>((message->grid).lonInc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (0 < (message->grid).nj) {
    iVar6 = 0;
    iVar2 = 0;
    do {
      if (0 < (message->grid).ni) {
        lVar5 = 0;
        do {
          poVar4 = std::ostream::_M_insert<double>(message->values[iVar2 + lVar5]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          lVar5 = lVar5 + 1;
        } while ((int)lVar5 < (message->grid).ni);
        iVar2 = iVar2 + (int)lVar5;
      }
      poVar4 = (this->super_Output).out;
      cVar1 = (char)poVar4;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      iVar6 = iVar6 + 1;
    } while (iVar6 < (message->grid).nj);
  }
  return;
}

Assistant:

void Txt::setComponent(const G2DEC_Message& message)
{
    const G2DEC_Grid& grid = message.grid;

    out << "Parameter id: " << message.parameter << endl;
    out << "Latitude: [" << grid.lat1 << ", " << grid.lat2 << ", " << grid.latInc << "]"
        << ", Longitude: [" << grid.lon1 << ", " << grid.lon2 << ", " << grid.lonInc << "]"
        << endl;

    int n = 0;
    for (int j = 0; j < grid.nj; j++) {
        for (int i = 0; i < grid.ni; i++)
            out << message.values[n++] << " ";
        out << endl;
    }
}